

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZEqnArray<std::complex<double>_>_>::Resize
          (TPZVec<TPZEqnArray<std::complex<double>_>_> *this,int64_t newsize,
          TPZEqnArray<std::complex<double>_> *object)

{
  TPZEqnArray<std::complex<double>_> *pTVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ostream *this_00;
  ulong uVar4;
  ulong in_RSI;
  long in_RDI;
  ulong uVar5;
  int64_t i;
  int64_t large;
  TPZEqnArray<std::complex<double>_> *newstore;
  TPZEqnArray<std::complex<double>_> *in_stack_ffffffffffffff38;
  TPZEqnArray<std::complex<double>_> *in_stack_ffffffffffffff40;
  TPZEqnArray<std::complex<double>_> *this_01;
  ulong local_98;
  TPZEqnArray<std::complex<double>_> *in_stack_ffffffffffffff70;
  ulong *local_70;
  long local_40;
  ulong *local_20;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      local_20 = (ulong *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_RSI;
      uVar4 = SUB168(auVar3 * ZEXT816(0x51d0),0);
      uVar5 = uVar4 + 8;
      if (SUB168(auVar3 * ZEXT816(0x51d0),8) != 0 || 0xfffffffffffffff7 < uVar4) {
        uVar5 = 0xffffffffffffffff;
      }
      local_20 = (ulong *)operator_new__(uVar5);
      *local_20 = in_RSI;
      local_20 = local_20 + 1;
      if (in_RSI != 0) {
        local_70 = local_20;
        do {
          TPZEqnArray<std::complex<double>_>::TPZEqnArray(in_stack_ffffffffffffff70);
          local_70 = local_70 + 0xa3a;
        } while (local_70 != local_20 + in_RSI * 0xa3a);
      }
    }
    local_98 = in_RSI;
    if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
      local_98 = *(ulong *)(in_RDI + 0x10);
    }
    for (local_40 = 0; local_40 < (long)local_98; local_40 = local_40 + 1) {
      TPZEqnArray<std::complex<double>_>::operator=
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    for (; local_40 < (long)in_RSI; local_40 = local_40 + 1) {
      TPZEqnArray<std::complex<double>_>::operator=
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    if (*(long *)(in_RDI + 8) != 0) {
      pTVar1 = *(TPZEqnArray<std::complex<double>_> **)(in_RDI + 8);
      if (pTVar1 != (TPZEqnArray<std::complex<double>_> *)0x0) {
        lVar2 = *(long *)&pTVar1[-1].fLastTerm;
        this_01 = pTVar1 + lVar2;
        while (pTVar1 != this_01) {
          this_01 = this_01 + -1;
          TPZEqnArray<std::complex<double>_>::~TPZEqnArray(this_01);
        }
        operator_delete__(&pTVar1[-1].fLastTerm,lVar2 * 0x51d0 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    *(ulong **)(in_RDI + 8) = local_20;
    *(ulong *)(in_RDI + 0x10) = in_RSI;
    *(ulong *)(in_RDI + 0x18) = in_RSI;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}